

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader_test.cpp
# Opt level: O2

void __thiscall license::test::product_not_licensed::test_method(product_not_licensed *this)

{
  bool bVar1;
  AuditEvent *pAVar2;
  undefined1 local_11a8 [24];
  char *local_1190;
  vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_> licenseInfos;
  long local_1170 [2];
  shared_count sStack_1160;
  LicenseReader licenseReader;
  char *local_1148;
  char *local_1140;
  char *local_1138;
  char *local_1130;
  string location;
  EventRegistry registry;
  char *local_10a8;
  char *local_10a0;
  char *local_1098;
  char *local_1090;
  undefined1 *local_1088;
  undefined1 *local_1080;
  char *local_1078;
  char *local_1070;
  char *local_1068;
  char *local_1060;
  undefined1 *local_1058;
  undefined1 *local_1050;
  char *local_1048;
  char *local_1040;
  LicenseLocation licLocation;
  
  std::__cxx11::string::string
            ((string *)&location,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/test_reader.ini"
             ,(allocator *)&licLocation);
  memset(&licLocation,0,0x1004);
  if (location._M_string_length != 0) {
    memmove(licLocation.licenseData,location._M_dataplus._M_p,location._M_string_length);
  }
  LicenseReader::LicenseReader(&licenseReader,&licLocation);
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  licenseInfos.
  super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)local_11a8,"PRODUCT-NOT",(allocator *)local_1170);
  LicenseReader::readLicenses(&registry,&licenseReader,(string *)local_11a8,&licenseInfos);
  std::__cxx11::string::~string((string *)local_11a8);
  local_1048 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1040 = "";
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1050 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1048,0x31);
  bVar1 = EventRegistry::isGood(&registry);
  local_1170[0] = CONCAT71(local_1170[0]._1_7_,!bVar1);
  local_1170[1] = 0;
  sStack_1160.pi_ = (sp_counted_base *)0x0;
  local_1190 = (char *)&local_1138;
  local_1138 = "!registry.isGood()";
  local_1130 = "";
  local_11a8[8] = 0;
  local_11a8._0_8_ = &PTR__lazy_ostream_001cf238;
  local_11a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1068 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1060 = "";
  boost::test_tools::tt_detail::report_assertion(local_1170,local_11a8,&local_1068,0x31,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1160);
  local_1078 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1070 = "";
  local_1088 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1078,0x32);
  local_11a8[8] = 0;
  local_11a8._0_8_ = &PTR__lazy_ostream_001cf288;
  local_11a8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_1190 = "";
  local_1098 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
  ;
  local_1090 = "";
  local_1138 = (char *)((ulong)local_1138 & 0xffffffff00000000);
  local_1170[0] =
       ((long)licenseInfos.
              super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)licenseInfos.
             super__Vector_base<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x98;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,unsigned_long>
            (local_11a8,&local_1098,0x32,1,2,&local_1138,"0",local_1170,"licenseInfos.size()");
  pAVar2 = EventRegistry::getLastFailure(&registry);
  if (pAVar2 != (AuditEvent *)0x0) {
    local_10a8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_10a0 = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_10a8,0x34);
    local_11a8[8] = 0;
    local_11a8._0_8_ = &PTR__lazy_ostream_001cf288;
    local_11a8._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_1190 = "";
    local_1148 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
    ;
    local_1140 = "";
    local_1170[0] = CONCAT44(local_1170[0]._4_4_,6);
    pAVar2 = EventRegistry::getLastFailure(&registry);
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,LCC_EVENT_TYPE,LCC_EVENT_TYPE>
              (local_11a8,&local_1148,0x34,1,2,local_1170,"PRODUCT_NOT_LICENSED",&pAVar2->event_type
               ,"registry.getLastFailure()->event_type");
    EventRegistry::~EventRegistry(&registry);
    std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::~vector
              (&licenseInfos);
    LicenseReader::~LicenseReader(&licenseReader);
    std::__cxx11::string::~string((string *)&location);
    return;
  }
  __assert_fail("registry.getLastFailure() != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/library/LicenseReader_test.cpp"
                ,0x33,"void license::test::product_not_licensed::test_method()");
}

Assistant:

BOOST_AUTO_TEST_CASE(product_not_licensed) {
	string location = PROJECT_TEST_SRC_DIR "/library/test_reader.ini";
	LicenseLocation licLocation = {LICENSE_PATH};
	std::copy(location.begin(), location.end(), licLocation.licenseData);
	LicenseReader licenseReader(&licLocation);
	vector<FullLicenseInfo> licenseInfos;
	const EventRegistry registry = licenseReader.readLicenses("PRODUCT-NOT", licenseInfos);
	BOOST_CHECK(!registry.isGood());
	BOOST_CHECK_EQUAL(0, licenseInfos.size());
	BOOST_ASSERT(registry.getLastFailure() != NULL);
	BOOST_CHECK_EQUAL(PRODUCT_NOT_LICENSED, registry.getLastFailure()->event_type);
}